

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

bool duckdb::FromCStringCastWrapper<duckdb::TryCast>::Operation<char*,duckdb::timestamp_t>
               (char *input_str,timestamp_t *result)

{
  bool bVar1;
  string_t input;
  anon_union_16_2_67f50693_for_value local_20;
  
  string_t::string_t((string_t *)&local_20.pointer,input_str);
  bVar1 = TryCast::Operation<duckdb::string_t,duckdb::timestamp_t>((string_t)local_20,result,false);
  return bVar1;
}

Assistant:

static bool Operation(SOURCE_TYPE input_str, RESULT_TYPE &result) {
		string_t input(input_str);
		return OP::template Operation<string_t, RESULT_TYPE>(input, result);
	}